

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O0

int lfilter(lua_State *L)

{
  undefined4 *puVar1;
  lua_Integer lVar2;
  uint8_t *local_30;
  char *buffer;
  int size;
  skynet_socket_message *message;
  lua_State *L_local;
  
  puVar1 = (undefined4 *)lua_touserdata(L,2);
  lVar2 = luaL_checkinteger(L,3);
  local_30 = *(uint8_t **)(puVar1 + 4);
  if (local_30 == (uint8_t *)0x0) {
    local_30 = (uint8_t *)(puVar1 + 6);
    buffer._4_4_ = (int)lVar2 + -0x18;
  }
  else {
    buffer._4_4_ = -1;
  }
  lua_settop(L,1);
  switch(*puVar1) {
  case 1:
    if (buffer._4_4_ != -1) {
      __assert_fail("size == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-netpack.c"
                    ,0x160,"int lfilter(lua_State *)");
    }
    L_local._4_4_ = filter_data(L,puVar1[1],local_30,puVar1[2]);
    break;
  case 2:
    L_local._4_4_ = 1;
    break;
  case 3:
    close_uncomplete(L,puVar1[1]);
    lua_pushvalue(L,-0xf462d);
    lua_pushinteger(L,(long)(int)puVar1[1]);
    L_local._4_4_ = 3;
    break;
  case 4:
    lua_pushvalue(L,-0xf462c);
    lua_pushinteger(L,(long)(int)puVar1[2]);
    pushstring(L,(char *)local_30,buffer._4_4_);
    L_local._4_4_ = 4;
    break;
  case 5:
    close_uncomplete(L,puVar1[1]);
    lua_pushvalue(L,-0xf462b);
    lua_pushinteger(L,(long)(int)puVar1[1]);
    pushstring(L,(char *)local_30,buffer._4_4_);
    L_local._4_4_ = 4;
    break;
  default:
    L_local._4_4_ = 1;
    break;
  case 7:
    lua_pushvalue(L,-0xf462e);
    lua_pushinteger(L,(long)(int)puVar1[1]);
    lua_pushinteger(L,(long)(int)puVar1[2]);
    L_local._4_4_ = 4;
  }
  return L_local._4_4_;
}

Assistant:

static int
lfilter(lua_State *L) {
	struct skynet_socket_message *message = lua_touserdata(L,2);
	int size = luaL_checkinteger(L,3);
	char * buffer = message->buffer;
	if (buffer == NULL) {
		buffer = (char *)(message+1);
		size -= sizeof(*message);
	} else {
		size = -1;
	}

	lua_settop(L, 1);

	switch(message->type) {
	case SKYNET_SOCKET_TYPE_DATA:
		// ignore listen id (message->id)
		assert(size == -1);	// never padding string
		return filter_data(L, message->id, (uint8_t *)buffer, message->ud);
	case SKYNET_SOCKET_TYPE_CONNECT:
		// ignore listen fd connect
		return 1;
	case SKYNET_SOCKET_TYPE_CLOSE:
		// no more data in fd (message->id)
		close_uncomplete(L, message->id);
		lua_pushvalue(L, lua_upvalueindex(TYPE_CLOSE));
		lua_pushinteger(L, message->id);
		return 3;
	case SKYNET_SOCKET_TYPE_ACCEPT:
		lua_pushvalue(L, lua_upvalueindex(TYPE_OPEN));
		// ignore listen id (message->id);
		lua_pushinteger(L, message->ud);
		pushstring(L, buffer, size);
		return 4;
	case SKYNET_SOCKET_TYPE_ERROR:
		// no more data in fd (message->id)
		close_uncomplete(L, message->id);
		lua_pushvalue(L, lua_upvalueindex(TYPE_ERROR));
		lua_pushinteger(L, message->id);
		pushstring(L, buffer, size);
		return 4;
	case SKYNET_SOCKET_TYPE_WARNING:
		lua_pushvalue(L, lua_upvalueindex(TYPE_WARNING));
		lua_pushinteger(L, message->id);
		lua_pushinteger(L, message->ud);
		return 4;
	default:
		// never get here
		return 1;
	}
}